

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O2

void __thiscall xLearn::InmemReader::init_from_txt(InmemReader *this)

{
  string *filename;
  bool label;
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  char *pcVar4;
  Parser *pPVar5;
  Reader *file;
  uint64_t uVar6;
  uint64_t uVar7;
  int i;
  size_t len;
  long lVar8;
  Reader *this_00;
  size_t ret;
  
  Reader::check_file_format_abi_cxx11_((string *)&ret,&this->super_Reader);
  pPVar5 = Reader::CreateParser(&this->super_Reader,(char *)ret);
  (this->super_Reader).parser_ = pPVar5;
  std::__cxx11::string::~string((string *)&ret);
  pPVar5 = (this->super_Reader).parser_;
  pPVar5->has_label_ = (this->super_Reader).has_label_;
  std::__cxx11::string::_M_assign((string *)&pPVar5->splitor_);
  filename = &(this->super_Reader).filename_;
  len = (this->super_Reader).block_size_ << 0x14;
  file = (Reader *)OpenFileOrDie((this->super_Reader).filename_._M_dataplus._M_p,"r");
  while( true ) {
    this_00 = file;
    ret = ReadDataFromDisk((FILE *)file,(this->super_Reader).block_,len);
    if (ret == 0) break;
    if (ret == len) {
      Reader::shrink_block(this_00,(this->super_Reader).block_,&ret,(FILE *)file);
    }
    pPVar5 = (this->super_Reader).parser_;
    (*pPVar5->_vptr_Parser[2])(pPVar5,(this->super_Reader).block_,ret,&this->data_buf_,0);
  }
  uVar6 = HashFile(filename,true);
  uVar7 = HashFile(filename,false);
  (this->data_buf_).hash_value_1 = uVar6;
  (this->data_buf_).hash_value_2 = uVar7;
  label = (this->super_Reader).has_label_;
  (this->data_buf_).has_label = label;
  uVar1 = (this->data_buf_).row_length;
  this->num_samples_ = uVar1;
  DMatrix::ReAlloc(&(this->super_Reader).data_samples_,(ulong)uVar1,label);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->order_,(ulong)this->num_samples_);
  puVar2 = (this->order_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (this->order_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (lVar8 = 0; (long)puVar3 - (long)puVar2 >> 2 != lVar8; lVar8 = lVar8 + 1) {
    puVar2[lVar8] = (uint)lVar8;
  }
  if ((this->super_Reader).bin_out_ != false) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret,
                   filename,".bin");
    DMatrix::Serialize(&this->data_buf_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret);
    std::__cxx11::string::~string((string *)&ret);
  }
  pcVar4 = (this->super_Reader).block_;
  if (pcVar4 != (char *)0x0) {
    operator_delete__(pcVar4);
  }
  Close((FILE *)file);
  return;
}

Assistant:

void InmemReader::init_from_txt() {
  // Init parser_                       
  parser_ = CreateParser(check_file_format().c_str());
  if (has_label_) parser_->setLabel(true);
  else parser_->setLabel(false);
  // Set splitor
  parser_->setSplitor(this->splitor_);
  // Convert MB to Byte
  uint64 read_byte = block_size_ * 1024 * 1024;
  // Open file
#ifndef _MSC_VER
  FILE* file = OpenFileOrDie(filename_.c_str(), "r");
#else
  FILE* file = OpenFileOrDie(filename_.c_str(), "rb");
#endif
  // Read until the end of file
  for (;;) {
    // Read a block of data from disk file
    size_t ret = ReadDataFromDisk(file, block_, read_byte);
    if (ret == 0) {
      break;
    } else if (ret == read_byte) {
      // Find the last '\n', and shrink back file pointer
      this->shrink_block(block_, &ret, file);
    } // else ret < read_byte: we don't need shrink_block()
    parser_->Parse(block_, ret, data_buf_, false);
  }
  data_buf_.SetHash(HashFile(filename_, true),
                    HashFile(filename_, false));
  data_buf_.has_label = has_label_;
  // Init data_samples_ 
  num_samples_ = data_buf_.row_length;
  data_samples_.ReAlloc(num_samples_, has_label_);
  // for shuffle
  order_.resize(num_samples_);
  for (int i = 0; i < order_.size(); ++i) {
    order_[i] = i;
  }
  // Deserialize in-memory buffer to disk file.
  if (bin_out_) {
    std::string bin_file = filename_ + ".bin";
    data_buf_.Serialize(bin_file);
  }
  delete [] block_;
  Close(file);
}